

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O2

void * StateLegalMoves(pyhanabi_state_t *state)

{
  HanabiState *this;
  vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
  *__return_storage_ptr__;
  
  if (state == (pyhanabi_state_t *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x1aa,"void *StateLegalMoves(pyhanabi_state_t *)");
  }
  this = (HanabiState *)state->state;
  if (this != (HanabiState *)0x0) {
    __return_storage_ptr__ =
         (vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
          *)operator_new(0x18);
    hanabi_learning_env::HanabiState::LegalMoves(__return_storage_ptr__,this,this->cur_player_);
    return __return_storage_ptr__;
  }
  __assert_fail("state->state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x1ab,"void *StateLegalMoves(pyhanabi_state_t *)");
}

Assistant:

void* StateLegalMoves(pyhanabi_state_t* state) {
  REQUIRE(state != nullptr);
  REQUIRE(state->state != nullptr);
  auto hanabi_state =
      reinterpret_cast<hanabi_learning_env::HanabiState*>(state->state);
  std::vector<hanabi_learning_env::HanabiMove>* list =
      new std::vector<hanabi_learning_env::HanabiMove>(
          hanabi_state->LegalMoves(hanabi_state->CurPlayer()));
  return static_cast<void*>(list);
}